

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1e8ba::CpuTest_rti_Test::TestBody(CpuTest_rti_Test *this)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar4;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar5;
  char *message;
  AssertHelper local_1c8;
  Message local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar;
  Action<unsigned_char_(unsigned_short)> local_198;
  WithoutMatchers local_171;
  Matcher<unsigned_short> local_170;
  MockSpec<unsigned_char_(unsigned_short)> local_158;
  ReturnAction<int> local_138;
  Action<unsigned_char_(unsigned_short)> local_128;
  WithoutMatchers local_101;
  Matcher<unsigned_short> local_100;
  MockSpec<unsigned_char_(unsigned_short)> local_e8;
  ReturnAction<int> local_c8;
  Action<unsigned_char_(unsigned_short)> local_b8;
  WithoutMatchers local_91;
  Matcher<unsigned_short> local_90;
  MockSpec<unsigned_char_(unsigned_short)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_short> local_48;
  MockSpec<unsigned_char_(unsigned_short)> local_30;
  CpuTest_rti_Test *local_10;
  CpuTest_rti_Test *this_local;
  
  (this->super_CpuTest).registers.pc = 0x1234;
  local_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,'@');
  (this->super_CpuTest).registers.sp = '\n';
  (this->super_CpuTest).expected.p = '#';
  (this->super_CpuTest).expected.sp = (this->super_CpuTest).registers.sp + '\x03';
  (this->super_CpuTest).expected.pc = 0xdead;
  testing::Matcher<unsigned_short>::Matcher(&local_48,0x1235);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_30,&(this->super_CpuTest).mmu.super_MockMmu,&local_48);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_30,local_55,(void *)0x0);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
            (pMVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
             ,0x1af,"mmu","read_byte(0x1235)");
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_30);
  testing::Matcher<unsigned_short>::~Matcher(&local_48);
  bVar1 = (this->super_CpuTest).registers.sp;
  if (SCARRY4(bVar1 + 0x100,1)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  testing::Matcher<unsigned_short>::Matcher(&local_90,bVar1 + 0x101);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_78,&(this->super_CpuTest).mmu.super_MockMmu,&local_90);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_78,&local_91,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x1b1,"mmu","read_byte(kStackOffset + registers.sp + 1)");
  testing::Return<int>((testing *)&local_c8,0x13);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_b8,(ReturnAction *)&local_c8);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_b8);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_b8);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_c8);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_78);
  testing::Matcher<unsigned_short>::~Matcher(&local_90);
  bVar1 = (this->super_CpuTest).registers.sp;
  if (!SCARRY4(bVar1 + 0x100,2)) {
    testing::Matcher<unsigned_short>::Matcher(&local_100,bVar1 + 0x102);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_e8,&(this->super_CpuTest).mmu.super_MockMmu,&local_100);
    testing::internal::GetWithoutMatchers();
    pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_e8,&local_101,(void *)0x0);
    pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x1b3,"mmu","read_byte(kStackOffset + registers.sp + 2)");
    testing::Return<int>((testing *)&local_138,0xad);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_128,(ReturnAction *)&local_138);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar5,&local_128)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_128);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_138);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_e8);
    testing::Matcher<unsigned_short>::~Matcher(&local_100);
    bVar1 = (this->super_CpuTest).registers.sp;
    if (!SCARRY4(bVar1 + 0x100,3)) {
      testing::Matcher<unsigned_short>::Matcher(&local_170,bVar1 + 0x103);
      n_e_s::core::test::MockMmu::gmock_read_byte
                (&local_158,&(this->super_CpuTest).mmu.super_MockMmu,&local_170);
      testing::internal::GetWithoutMatchers();
      pMVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                         (&local_158,&local_171,(void *)0x0);
      pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                         (pMVar4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                          ,0x1b5,"mmu","read_byte(kStackOffset + registers.sp + 3)");
      testing::Return<int>((testing *)&gtest_ar.message_,0xde);
      testing::internal::ReturnAction::operator_cast_to_Action
                (&local_198,(ReturnAction *)&gtest_ar.message_);
      testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
                (pTVar5,&local_198);
      testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_198);
      testing::internal::ReturnAction<int>::~ReturnAction((ReturnAction<int> *)&gtest_ar.message_);
      testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_158);
      testing::Matcher<unsigned_short>::~Matcher(&local_170);
      n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x06');
      testing::internal::EqHelper::
      Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
                ((EqHelper *)local_1b8,"expected","registers",&(this->super_CpuTest).expected,
                 &(this->super_CpuTest).registers);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
      if (!bVar3) {
        testing::Message::Message(&local_1c0);
        message = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                   ,0x1b9,message);
        testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
        testing::internal::AssertHelper::~AssertHelper(&local_1c8);
        testing::Message::~Message(&local_1c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
      return;
    }
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

TEST_F(CpuTest, rti) {
    registers.pc = 0x1234;
    stage_instruction(RTI);
    registers.sp = 0x0A;
    expected.p = static_cast<uint8_t>(Z_FLAG | C_FLAG) | FLAG_5;
    expected.sp = registers.sp + static_cast<uint8_t>(3);
    expected.pc = 0xDEAD;

    // Dummy read
    EXPECT_CALL(mmu, read_byte(0x1235));

    EXPECT_CALL(mmu, read_byte(kStackOffset + registers.sp + 1))
            .WillOnce(Return(static_cast<uint8_t>(Z_FLAG | C_FLAG) | B_FLAG));
    EXPECT_CALL(mmu, read_byte(kStackOffset + registers.sp + 2))
            .WillOnce(Return(0xAD));
    EXPECT_CALL(mmu, read_byte(kStackOffset + registers.sp + 3))
            .WillOnce(Return(0xDE));

    step_execution(6);
    EXPECT_EQ(expected, registers);
}